

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info1394.c
# Opt level: O3

int main(int argc,char **argv)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  void *__ptr;
  ulong uVar5;
  undefined4 in_register_0000003c;
  long lVar6;
  
  lVar4 = raw1394_new_handle(CONCAT44(in_register_0000003c,argc));
  if (lVar4 == 0) {
    main_cold_2();
  }
  else {
    uVar2 = raw1394_get_port_info(lVar4,0,0);
    if (-1 < (int)uVar2) {
      __ptr = malloc((ulong)uVar2 * 0x24);
      uVar2 = raw1394_get_port_info(lVar4,__ptr,uVar2);
      if (0 < (int)uVar2) {
        lVar6 = (long)__ptr + 4;
        uVar5 = 0;
        do {
          printf("Port %d: %s (%d nodes)",uVar5 & 0xffffffff,lVar6,(ulong)*(uint *)(lVar6 + -4));
          if (uVar5 == 0) {
            iVar3 = raw1394_set_port(lVar4,0);
            if (iVar3 == 0) {
              uVar1 = raw1394_get_local_id(lVar4);
              printf(", local id 0x%4X (%d)",(ulong)uVar1,(ulong)(uVar1 & 0x3f));
            }
            putchar(10);
          }
          uVar5 = uVar5 + 1;
          lVar6 = lVar6 + 0x24;
        } while (uVar2 != uVar5);
      }
      free(__ptr);
      raw1394_destroy_handle(lVar4);
      return 0;
    }
  }
  main_cold_1();
  halt_baddata();
}

Assistant:

int main(int argc, char** argv)
{
    raw1394handle_t handle;
    struct raw1394_portinfo *ports;
    int nports;
    int i, rc;

    /* get handle to device and check for errors */
    handle = raw1394_new_handle();
    if (handle == NULL) {
        fprintf(stderr, "**** Error: could not open 1394 handle\n");
        exit(-1);
    }

    /* get number of ports and check for errors */
    nports = raw1394_get_port_info(handle, NULL, 0);
    if (nports < 0) {
        fprintf(stderr, "**** Error: could not get port info\n");
        exit(-1);
    }

    ports = (struct raw1394_portinfo *) malloc(nports*sizeof(struct raw1394_portinfo));
    nports = raw1394_get_port_info(handle, ports, nports);
    for (i = 0; i < nports; i++) {
      printf("Port %d: %s (%d nodes)", i, ports[i].name, ports[i].nodes);
      if (i == 0) {
          rc = raw1394_set_port(handle, i);
          if (!rc) {
              int id = raw1394_get_local_id(handle);
              printf(", local id 0x%4X (%d)", id, id&0x3f);
          }
          printf("\n");
      }
    }
    free(ports);

    raw1394_destroy_handle(handle);
    return 0;
}